

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::TestClass(TestClass *this)

{
  Selector *this_00;
  Timer *pTVar1;
  EventMethod<TestClass,_Event1> *pEVar2;
  EventMethod<TestClass,_Event2> *pEVar3;
  EventMethod<TestClass,_Event3> *pEVar4;
  AsyncEventAgent *obj;
  uint uVar5;
  
  (this->super_TimerListener)._vptr_TimerListener = (_func_int **)&PTR_onTimeout_00105ac8;
  this_00 = &this->mThread;
  Selector::Selector(this_00,(char *)0x0);
  (this->mPeriodEvent).mObj = (AsyncEventAgent *)0x0;
  TimerManager::getInstance();
  pTVar1 = (Timer *)TimerManager::getDefaultTimer();
  this->mDefaultTimer = pTVar1;
  pEVar2 = (EventMethod<TestClass,_Event1> *)
           operator_new(0x28,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                        ,0x89);
  (pEVar2->super_IEventListener)._vptr_IEventListener = (_func_int **)&PTR_receiveEvent_00105c50;
  pEVar2->mObject = this;
  pEVar2->mFunc = (event_method_t)ProcessFunc1;
  *(undefined8 *)&pEVar2->field_0x18 = 0;
  pEVar2->mDispatcher = (IEventDispatcher *)this_00;
  (**(code **)(*(long *)&this->mThread + 0x40))(this_00,pEVar2,0);
  this->mEvent1Handler = pEVar2;
  pEVar3 = (EventMethod<TestClass,_Event2> *)
           operator_new(0x28,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                        ,0x8b);
  (pEVar3->super_IEventListener)._vptr_IEventListener = (_func_int **)&PTR_receiveEvent_00105ca0;
  pEVar3->mObject = this;
  pEVar3->mFunc = (event_method_t)ProcessFunc2;
  *(undefined8 *)&pEVar3->field_0x18 = 0;
  pEVar3->mDispatcher = (IEventDispatcher *)this_00;
  (**(code **)(*(long *)&this->mThread + 0x40))(this_00,pEVar3,1);
  this->mEvent2Handler = pEVar3;
  pEVar4 = (EventMethod<TestClass,_Event3> *)
           operator_new(0x28,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                        ,0x8d);
  (pEVar4->super_IEventListener)._vptr_IEventListener = (_func_int **)&PTR_receiveEvent_00105ce0;
  pEVar4->mObject = this;
  pEVar4->mFunc = (event_method_t)ProcessFunc3;
  *(undefined8 *)&pEVar4->field_0x18 = 0;
  pEVar4->mDispatcher = (IEventDispatcher *)this_00;
  (**(code **)(*(long *)&this->mThread + 0x40))(this_00,pEVar4,2);
  this->mEvent3Handler = pEVar4;
  obj = (AsyncEventAgent *)
        operator_new(0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                     ,0x8f);
  (obj->super_EventAgent).super_Event.super_RefCount.mRefCount = 0;
  *(undefined8 *)&(obj->super_EventAgent).super_Event.super_RefCount.field_0xc = 0xfffffffb;
  (obj->super_EventAgent).super_Event.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR_onRefCountZero_00105d20;
  obj[1].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)this;
  *(code **)&obj[1].super_EventAgent.super_Event.super_RefCount.mRefCount = handlePeriodic;
  *(undefined8 *)&obj[1].super_EventAgent.super_Event.mPriority = 0;
  SmartPtr<AsyncEventAgent>::operator=(&this->mPeriodEvent,obj);
  uVar5 = (uint)this;
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar5,2000);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar5,500);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar5,0xdac);
  Timer::addTimer((TimerListener *)this->mDefaultTimer,uVar5,0x9c4);
  this->mPeriodElapsed = 0;
  this->mPeriodCount = 0;
  return;
}

Assistant:

TestClass::TestClass()
{
	mDefaultTimer = TimerManager::getInstance()->getDefaultTimer();

	mEvent1Handler = jh_new EventMethod<TestClass,Event1>(
		this, &TestClass::ProcessFunc1, &mThread );
	mEvent2Handler = jh_new EventMethod<TestClass,Event2>(
		this, &TestClass::ProcessFunc2, &mThread );
	mEvent3Handler = jh_new EventMethod<TestClass,Event3>(
		this, &TestClass::ProcessFunc3, &mThread );
	mPeriodEvent = jh_new AsyncEventAgent0<TestClass>(
		this, &TestClass::handlePeriodic );
		
	mDefaultTimer->addTimer( this, 2000, 2345 );
	mDefaultTimer->addTimer( this, 500, 1234 );
	mDefaultTimer->addTimer( this, 3500, 4567 );
	mDefaultTimer->addTimer( this, 2500, 3456 );
	
	mPeriodElapsed = 0;
	mPeriodCount = 0;
}